

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileline.c
# Opt level: O3

int fileline_initialize(backtrace_state *state,backtrace_error_callback error_callback,void *data)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  char buf [64];
  fileline local_50;
  fileline fileline_fn;
  backtrace_error_callback p_Stack_40;
  int does_not_exist;
  void *local_38;
  
  if (state->threaded == 0) {
    if (state->fileline_initialization_failed == 0) {
      if (state->fileline_fn != (fileline)0x0) {
        return 1;
      }
      iVar3 = -1;
      bVar1 = false;
      iVar5 = 0;
      local_50 = (fileline)0x0;
      p_Stack_40 = error_callback;
      local_38 = data;
      do {
        pcVar4 = state->filename;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
        else {
          iVar3 = tcmalloc_backtrace_open
                            (pcVar4,p_Stack_40,local_38,(int *)((long)&fileline_fn + 4));
          bVar2 = true;
          if (fileline_fn._4_4_ != 0) {
            bVar2 = bVar1;
          }
          if ((-1 < iVar3) || (bVar1 = bVar2, fileline_fn._4_4_ == 0)) break;
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != 10);
      if (iVar3 < 0) {
        if (!bVar1) {
          pcVar4 = state->filename;
          if (pcVar4 == (char *)0x0) {
            pcVar4 = "libbacktrace could not find executable to open";
            iVar3 = 0;
          }
          else {
            iVar3 = 2;
          }
          (*p_Stack_40)(local_38,pcVar4,iVar3);
        }
      }
      else {
        iVar3 = tcmalloc_backtrace_initialize(state,pcVar4,iVar3,p_Stack_40,local_38,&local_50);
        if (iVar3 != 0) {
          if (state->threaded == 0) {
            state->fileline_fn = local_50;
            return 1;
          }
          goto LAB_0012279f;
        }
      }
      if (state->threaded != 0) goto LAB_0012279f;
      state->fileline_initialization_failed = 1;
    }
    else {
      (*error_callback)(data,"failed to read executable information",-1);
    }
    return 0;
  }
LAB_0012279f:
  abort();
}

Assistant:

static int
fileline_initialize (struct backtrace_state *state,
		     backtrace_error_callback error_callback, void *data)
{
  int failed;
  fileline fileline_fn;
  int pass;
  int called_error_callback;
  int descriptor;
  const char *filename;
  char buf[FILENAME_BUF_SIZE];

  if (!state->threaded)
    failed = state->fileline_initialization_failed;
  else
    failed = backtrace_atomic_load_int (&state->fileline_initialization_failed);

  if (failed)
    {
      error_callback (data, "failed to read executable information", -1);
      return 0;
    }

  if (!state->threaded)
    fileline_fn = state->fileline_fn;
  else
    fileline_fn = backtrace_atomic_load_pointer (&state->fileline_fn);
  if (fileline_fn != NULL)
    return 1;

  /* We have not initialized the information.  Do it now.  */

  descriptor = -1;
  called_error_callback = 0;
  for (pass = 0; pass < 10; ++pass)
    {
      int does_not_exist;

      switch (pass)
	{
	case 0:
	  filename = state->filename;
	  break;
	case 1:
	  filename = getexecname ();
	  break;
	case 2:
	  /* Test this before /proc/self/exe, as the latter exists but points
	     to the wine binary (and thus doesn't work).  */
	  filename = windows_executable_filename ();
	  break;
	case 3:
	  filename = "/proc/self/exe";
	  break;
	case 4:
	  filename = "/proc/curproc/file";
	  break;
	case 5:
	  snprintf (buf, sizeof (buf), "/proc/%ld/object/a.out",
		    (long) getpid ());
	  filename = buf;
	  break;
	case 6:
	  filename = sysctl_exec_name1 (state, error_callback, data);
	  break;
	case 7:
	  filename = sysctl_exec_name2 (state, error_callback, data);
	  break;
	case 8:
	  filename = macho_get_executable_path (state, error_callback, data);
	  break;
	case 9:
	  filename = windows_get_executable_path (buf, error_callback, data);
	  break;
	default:
	  abort ();
	}

      if (filename == NULL)
	continue;

      descriptor = backtrace_open (filename, error_callback, data,
				   &does_not_exist);
      if (descriptor < 0 && !does_not_exist)
	{
	  called_error_callback = 1;
	  break;
	}
      if (descriptor >= 0)
	break;
    }

  if (descriptor < 0)
    {
      if (!called_error_callback)
	{
	  if (state->filename != NULL)
	    error_callback (data, state->filename, ENOENT);
	  else
	    error_callback (data,
			    "libbacktrace could not find executable to open",
			    0);
	}
      failed = 1;
    }

  if (!failed)
    {
      if (!backtrace_initialize (state, filename, descriptor, error_callback,
				 data, &fileline_fn))
	failed = 1;
    }

  if (failed)
    {
      if (!state->threaded)
	state->fileline_initialization_failed = 1;
      else
	backtrace_atomic_store_int (&state->fileline_initialization_failed, 1);
      return 0;
    }

  if (!state->threaded)
    state->fileline_fn = fileline_fn;
  else
    {
      backtrace_atomic_store_pointer (&state->fileline_fn, fileline_fn);

      /* Note that if two threads initialize at once, one of the data
	 sets may be leaked.  */
    }

  return 1;
}